

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzSub2(word *b,word *a,size_t n)

{
  ulong uVar1;
  size_t i;
  word w;
  word borrow;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  borrow = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = a[i] + borrow;
    borrow = (word)(int)(uint)(b[i] < uVar1 || uVar1 < borrow);
    b[i] = b[i] - uVar1;
  }
  return borrow;
}

Assistant:

word zzSub2(word b[], const word a[], size_t n)
{
	register word borrow = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = a[i] + borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(b[i], w);
		b[i] -= w;
#else
		w = b[i] - borrow;
		if (w > (word)~borrow)
			w = ~a[i];
		else
			w -= a[i], borrow = w > (word)~a[i];
		b[i] = w;
#endif
	}
	w = 0;
	return borrow;
}